

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O0

satoko_t * Gia_ManSatokoInit(Cnf_Dat_t *pCnf,satoko_opts_t *opts)

{
  int iVar1;
  satoko_t *s;
  int local_2c;
  int i;
  satoko_t *pSat;
  satoko_opts_t *opts_local;
  Cnf_Dat_t *pCnf_local;
  
  s = satoko_create();
  local_2c = 0;
  while( true ) {
    if (pCnf->nClauses <= local_2c) {
      satoko_configure(s,opts);
      return s;
    }
    iVar1 = satoko_add_clause(s,pCnf->pClauses[local_2c],
                              (int)((long)pCnf->pClauses[local_2c + 1] -
                                    (long)pCnf->pClauses[local_2c] >> 2));
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  satoko_destroy(s);
  return (satoko_t *)0x0;
}

Assistant:

satoko_t * Gia_ManSatokoInit( Cnf_Dat_t * pCnf, satoko_opts_t * opts )
{
    satoko_t * pSat = satoko_create();
    int i;
    //sat_solver_setnvars( pSat, p->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
        {
            satoko_destroy( pSat );
            return NULL;
        }
    }
    satoko_configure(pSat, opts);
    return pSat;
}